

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  undefined2 uVar1;
  int a_00;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  stbi_uc *psVar6;
  ulong uVar8;
  long lVar9;
  stbi__uint32 sVar10;
  ulong uVar11;
  stbi_uc *psVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  byte bVar21;
  int iVar22;
  long lVar23;
  byte bVar24;
  long lVar25;
  uint uVar26;
  byte *pbVar27;
  int iVar28;
  uint uVar29;
  stbi_uc *psVar30;
  byte *pbVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  int local_dc;
  ulong local_a0;
  ulong uVar7;
  
  local_dc = 0;
  a_00 = a->s->img_n;
  bVar34 = depth == 0x10;
  psVar6 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar34,0);
  a->out = psVar6;
  if (psVar6 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar3 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar3 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      uVar18 = a_00 * x;
      uVar4 = uVar18 * depth + 7 >> 3;
      uVar7 = (ulong)uVar4;
      if (raw_len < (uVar4 + 1) * y) {
        stbi__g_failure_reason = "not enough pixels";
      }
      else {
        uVar20 = x * out_n;
        if (y == 0) {
joined_r0x00326b82:
          local_dc = 1;
          if (depth == 0x10) {
LAB_00326b84:
            if (uVar20 * y == 0) {
LAB_00326f96:
              local_dc = 1;
            }
            else {
              local_dc = 1;
              lVar9 = 0;
              psVar6 = a->out;
              do {
                uVar1 = swap_bytes(*(undefined2 *)(psVar6 + lVar9 * 2));
                *(undefined2 *)(psVar6 + lVar9 * 2) = uVar1;
                lVar9 = lVar9 + 1;
              } while (uVar20 * y != (int)lVar9);
            }
          }
        }
        else {
          bVar21 = *raw;
          uVar14 = 0;
          if (depth < 8) {
            uVar14 = (ulong)(uVar20 - uVar4);
          }
          if (bVar21 < 5) {
            lVar33 = (long)(out_n << bVar34);
            uVar19 = uVar20 << bVar34;
            uVar8 = (ulong)y;
            uVar13 = 0;
            uVar11 = (ulong)uVar19;
            lVar23 = 0;
            lVar9 = -lVar33;
            local_a0 = (ulong)x;
            iVar3 = x - 1;
            psVar6 = a->out;
            uVar4 = a_00 << bVar34;
            do {
              uVar26 = uVar4;
              if (depth < 8) {
                local_a0 = uVar7;
                uVar26 = 1;
              }
              if (lVar23 == 0) {
                bVar21 = ""[bVar21];
              }
              lVar32 = uVar14 - uVar11;
              if (0 < (int)uVar26) {
                uVar17 = 0;
                do {
                  switch(bVar21) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar2 = raw[uVar17 + 1];
                    goto LAB_00326580;
                  case 2:
                  case 4:
                    bVar2 = psVar6[uVar17 + lVar32];
                    break;
                  case 3:
                    bVar2 = psVar6[uVar17 + lVar32] >> 1;
                    break;
                  default:
                    goto switchD_0032656a_default;
                  }
                  bVar2 = bVar2 + raw[uVar17 + 1];
LAB_00326580:
                  psVar6[uVar17 + uVar14] = bVar2;
switchD_0032656a_default:
                  uVar17 = uVar17 + 1;
                } while (uVar26 != uVar17);
              }
              if (depth == 8) {
                if (a_00 != out_n) {
                  psVar6[a_00] = 0xff;
                }
                raw = raw + (long)a_00 + 1;
                psVar30 = psVar6 + out_n;
                lVar25 = (long)out_n;
              }
              else if (depth == 0x10) {
                if (a_00 != out_n) {
                  (psVar6 + (int)uVar4)[0] = 0xff;
                  (psVar6 + (int)uVar4)[1] = 0xff;
                }
                raw = raw + (long)(int)uVar4 + 1;
                psVar30 = psVar6 + lVar33;
                lVar25 = lVar33;
              }
              else {
                raw = raw + 2;
                psVar30 = psVar6 + uVar14 + 1;
                lVar25 = 1;
              }
              psVar12 = psVar6 + lVar25 + lVar32;
              if (depth < 8 || a_00 == out_n) {
                uVar4 = ((int)local_a0 + -1) * uVar26;
                switch(bVar21) {
                case 0:
                  memcpy(psVar30,raw,(long)(int)uVar4);
                  break;
                case 1:
                  if (0 < (int)uVar4) {
                    uVar13 = 0;
                    do {
                      psVar30[uVar13] = psVar30[uVar13 - (long)(int)uVar26] + raw[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar4 != uVar13);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar4) {
                    uVar13 = 0;
                    do {
                      psVar30[uVar13] = psVar12[uVar13] + raw[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar4 != uVar13);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar4) {
                    uVar13 = 0;
                    do {
                      psVar30[uVar13] =
                           (char)((uint)psVar30[uVar13 - (long)(int)uVar26] + (uint)psVar12[uVar13]
                                 >> 1) + raw[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar4 != uVar13);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar4) {
                    uVar13 = 0;
                    do {
                      bVar21 = psVar30[uVar13 - (long)(int)uVar26];
                      bVar2 = psVar12[uVar13];
                      bVar24 = psVar6[uVar13 + (lVar25 - (int)uVar26) + (uVar14 - uVar11)];
                      iVar28 = ((uint)bVar2 + (uint)bVar21) - (uint)bVar24;
                      uVar15 = iVar28 - (uint)bVar21;
                      uVar5 = -uVar15;
                      if (0 < (int)uVar15) {
                        uVar5 = uVar15;
                      }
                      uVar16 = iVar28 - (uint)bVar2;
                      uVar15 = -uVar16;
                      if (0 < (int)uVar16) {
                        uVar15 = uVar16;
                      }
                      uVar29 = iVar28 - (uint)bVar24;
                      uVar16 = -uVar29;
                      if (0 < (int)uVar29) {
                        uVar16 = uVar29;
                      }
                      if (uVar15 <= uVar16) {
                        bVar24 = bVar2;
                      }
                      if (uVar16 < uVar5) {
                        bVar21 = bVar24;
                      }
                      if (uVar15 < uVar5) {
                        bVar21 = bVar24;
                      }
                      psVar30[uVar13] = bVar21 + raw[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar4 != uVar13);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar4) {
                    uVar13 = 0;
                    do {
                      psVar30[uVar13] = (psVar30[uVar13 - (long)(int)uVar26] >> 1) + raw[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar4 != uVar13);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar4) {
                    uVar13 = 0;
                    do {
                      psVar30[uVar13] = psVar30[uVar13 - (long)(int)uVar26] + raw[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar4 != uVar13);
                  }
                }
                raw = raw + (int)uVar4;
LAB_00326b0a:
                if (lVar23 + 1U == uVar8) {
                  if (7 < depth) goto joined_r0x00326b82;
                  if (y != 0) {
                    uVar4 = x - 1;
                    uVar26 = 0;
                    uVar14 = 0;
                    lVar23 = (ulong)uVar4 + 1;
                    lVar9 = uVar20 - uVar7;
                    do {
                      bVar21 = 1;
                      if (color == 0) {
                        bVar21 = ""[depth];
                      }
                      uVar11 = (ulong)uVar26;
                      psVar6 = a->out;
                      pbVar27 = psVar6 + uVar19 * (int)uVar14;
                      pbVar31 = pbVar27 + (uVar20 - uVar7);
                      if (depth == 4) {
                        uVar5 = uVar18;
                        if (1 < (int)uVar18) {
                          psVar30 = psVar6 + lVar9;
                          uVar15 = uVar18;
                          do {
                            psVar6[uVar11] = (psVar30[uVar11] >> 4) * bVar21;
                            pbVar31 = psVar30 + uVar11;
                            psVar30 = psVar30 + 1;
                            psVar6[uVar11 + 1] = (*pbVar31 & 0xf) * bVar21;
                            uVar5 = uVar15 - 2;
                            psVar6 = psVar6 + 2;
                            bVar34 = 3 < uVar15;
                            uVar15 = uVar5;
                          } while (bVar34);
                          pbVar27 = psVar6 + uVar11;
                          pbVar31 = psVar30 + uVar11;
                        }
                        if (uVar5 == 1) {
                          *pbVar27 = (*pbVar31 >> 4) * bVar21;
                        }
                      }
                      else if (depth == 2) {
                        uVar5 = uVar18;
                        if (3 < (int)uVar18) {
                          psVar30 = psVar6 + lVar9;
                          uVar15 = uVar18;
                          do {
                            uVar5 = uVar15 - 4;
                            psVar6[uVar11] = (psVar30[uVar11] >> 6) * bVar21;
                            psVar6[uVar11 + 1] = (psVar30[uVar11] >> 4 & 3) * bVar21;
                            psVar6[uVar11 + 2] = (psVar30[uVar11] >> 2 & 3) * bVar21;
                            pbVar31 = psVar30 + uVar11;
                            psVar30 = psVar30 + 1;
                            psVar6[uVar11 + 3] = (*pbVar31 & 3) * bVar21;
                            psVar6 = psVar6 + 4;
                            bVar34 = 7 < uVar15;
                            uVar15 = uVar5;
                          } while (bVar34);
                          pbVar27 = psVar6 + uVar11;
                          pbVar31 = psVar30 + uVar11;
                        }
                        if (((0 < (int)uVar5) && (*pbVar27 = (*pbVar31 >> 6) * bVar21, uVar5 != 1))
                           && (pbVar27[1] = (*pbVar31 >> 4 & 3) * bVar21, uVar5 == 3)) {
                          pbVar27[2] = (*pbVar31 >> 2 & 3) * bVar21;
                        }
                      }
                      else if (depth == 1) {
                        uVar5 = uVar18;
                        if (7 < (int)uVar18) {
                          psVar30 = psVar6 + lVar9;
                          uVar15 = uVar18;
                          do {
                            psVar6[uVar11] = (char)psVar30[uVar11] >> 7 & bVar21;
                            psVar6[uVar11 + 1] = (char)(psVar30[uVar11] * '\x02') >> 7 & bVar21;
                            psVar6[uVar11 + 2] = (char)(psVar30[uVar11] << 2) >> 7 & bVar21;
                            psVar6[uVar11 + 3] = (char)(psVar30[uVar11] << 3) >> 7 & bVar21;
                            psVar6[uVar11 + 4] = (char)(psVar30[uVar11] << 4) >> 7 & bVar21;
                            psVar6[uVar11 + 5] = (char)(psVar30[uVar11] << 5) >> 7 & bVar21;
                            psVar6[uVar11 + 6] = (char)(psVar30[uVar11] << 6) >> 7 & bVar21;
                            bVar2 = bVar21;
                            if ((psVar30[uVar11] & 1) == 0) {
                              bVar2 = 0;
                            }
                            psVar30 = psVar30 + 1;
                            psVar6[uVar11 + 7] = bVar2;
                            uVar5 = uVar15 - 8;
                            psVar6 = psVar6 + 8;
                            bVar34 = 0xf < uVar15;
                            uVar15 = uVar5;
                          } while (bVar34);
                          pbVar27 = psVar6 + uVar11;
                          pbVar31 = psVar30 + uVar11;
                        }
                        if (((((0 < (int)uVar5) &&
                              (*pbVar27 = (char)*pbVar31 >> 7 & bVar21, uVar5 != 1)) &&
                             ((pbVar27[1] = (char)(*pbVar31 * '\x02') >> 7 & bVar21, 2 < uVar5 &&
                              ((pbVar27[2] = (char)(*pbVar31 << 2) >> 7 & bVar21, uVar5 != 3 &&
                               (pbVar27[3] = (char)(*pbVar31 << 3) >> 7 & bVar21, 4 < uVar5)))))) &&
                            (pbVar27[4] = (char)(*pbVar31 << 4) >> 7 & bVar21, uVar5 != 5)) &&
                           (pbVar27[5] = (char)(*pbVar31 << 5) >> 7 & bVar21, uVar5 == 7)) {
                          pbVar27[6] = (char)(*pbVar31 << 6) >> 7 & bVar21;
                        }
                      }
                      if (a_00 != out_n) {
                        psVar6 = a->out;
                        if (a_00 == 1) {
                          lVar33 = lVar23;
                          if (-1 < (int)uVar4) {
                            do {
                              psVar6[lVar33 * 2 + (uVar11 - 1)] = 0xff;
                              psVar6[lVar33 * 2 + (uVar11 - 2)] = psVar6[lVar33 + (uVar11 - 1)];
                              lVar32 = lVar33 + -1;
                              bVar34 = 0 < lVar33;
                              lVar33 = lVar32;
                            } while (lVar32 != 0 && bVar34);
                          }
                        }
                        else if (-1 < (int)uVar4) {
                          psVar30 = psVar6 + (ulong)uVar4 * 3 + 2 + uVar11;
                          lVar33 = lVar23;
                          do {
                            psVar6[lVar33 * 4 + (uVar11 - 1)] = 0xff;
                            psVar6[lVar33 * 4 + (uVar11 - 2)] = *psVar30;
                            psVar6[lVar33 * 4 + (uVar11 - 3)] = psVar30[-1];
                            psVar12 = psVar30 + -2;
                            psVar30 = psVar30 + -3;
                            psVar6[lVar33 * 4 + (uVar11 - 4)] = *psVar12;
                            lVar32 = lVar33 + -1;
                            bVar34 = 0 < lVar33;
                            lVar33 = lVar32;
                          } while (lVar32 != 0 && bVar34);
                        }
                      }
                      uVar26 = uVar26 + uVar19;
                      uVar14 = uVar14 + 1;
                    } while (uVar14 != uVar8);
                    return 1;
                  }
                  goto LAB_00326f96;
                }
              }
              else {
                switch(bVar21) {
                case 0:
                  if (iVar3 != 0) {
                    iVar28 = iVar3;
                    do {
                      if (0 < (int)uVar26) {
                        uVar17 = 0;
                        do {
                          psVar30[uVar17] = raw[uVar17];
                          uVar17 = uVar17 + 1;
                        } while (uVar26 != uVar17);
                      }
                      psVar30[(int)uVar4] = 0xff;
                      raw = raw + (int)uVar4;
                      psVar30 = psVar30 + lVar33;
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  break;
                case 1:
                  if (iVar3 != 0) {
                    lVar32 = (long)psVar30 + lVar9;
                    iVar28 = iVar3;
                    do {
                      if (0 < (int)uVar26) {
                        uVar17 = 0;
                        do {
                          psVar30[uVar17] = *(char *)(lVar32 + uVar17) + raw[uVar17];
                          uVar17 = uVar17 + 1;
                        } while (uVar26 != uVar17);
                      }
                      psVar30[(int)uVar4] = 0xff;
                      raw = raw + (int)uVar4;
                      psVar30 = psVar30 + lVar33;
                      lVar32 = lVar32 + lVar33;
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  break;
                case 2:
                  if (iVar3 != 0) {
                    iVar28 = iVar3;
                    do {
                      if (0 < (int)uVar26) {
                        uVar17 = 0;
                        do {
                          psVar30[uVar17] = psVar12[uVar17] + raw[uVar17];
                          uVar17 = uVar17 + 1;
                        } while (uVar26 != uVar17);
                      }
                      psVar30[(int)uVar4] = 0xff;
                      raw = raw + (int)uVar4;
                      psVar30 = psVar30 + lVar33;
                      psVar12 = psVar12 + lVar33;
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  break;
                case 3:
                  if (iVar3 != 0) {
                    lVar32 = (long)psVar30 + lVar9;
                    iVar28 = iVar3;
                    do {
                      if (0 < (int)uVar26) {
                        uVar17 = 0;
                        do {
                          psVar30[uVar17] =
                               (char)((uint)*(byte *)(lVar32 + uVar17) + (uint)psVar12[uVar17] >> 1)
                               + raw[uVar17];
                          uVar17 = uVar17 + 1;
                        } while (uVar26 != uVar17);
                      }
                      psVar30[(int)uVar4] = 0xff;
                      raw = raw + (int)uVar4;
                      psVar30 = psVar30 + lVar33;
                      psVar12 = psVar12 + lVar33;
                      lVar32 = lVar32 + lVar33;
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  break;
                case 4:
                  if (iVar3 != 0) {
                    psVar6 = psVar6 + lVar25 + ((uVar14 - lVar33) - uVar11);
                    lVar32 = (long)psVar30 + lVar9;
                    iVar28 = iVar3;
                    do {
                      if (0 < (int)uVar26) {
                        uVar17 = 0;
                        do {
                          bVar21 = *(byte *)(lVar32 + uVar17);
                          bVar2 = psVar12[uVar17];
                          bVar24 = psVar6[uVar17];
                          iVar22 = ((uint)bVar2 + (uint)bVar21) - (uint)bVar24;
                          uVar15 = iVar22 - (uint)bVar21;
                          uVar5 = -uVar15;
                          if (0 < (int)uVar15) {
                            uVar5 = uVar15;
                          }
                          uVar16 = iVar22 - (uint)bVar2;
                          uVar15 = -uVar16;
                          if (0 < (int)uVar16) {
                            uVar15 = uVar16;
                          }
                          uVar29 = iVar22 - (uint)bVar24;
                          uVar16 = -uVar29;
                          if (0 < (int)uVar29) {
                            uVar16 = uVar29;
                          }
                          if (uVar15 <= uVar16) {
                            bVar24 = bVar2;
                          }
                          if (uVar16 < uVar5) {
                            bVar21 = bVar24;
                          }
                          if (uVar15 < uVar5) {
                            bVar21 = bVar24;
                          }
                          psVar30[uVar17] = bVar21 + raw[uVar17];
                          uVar17 = uVar17 + 1;
                        } while (uVar26 != uVar17);
                      }
                      psVar30[(int)uVar4] = 0xff;
                      raw = raw + (int)uVar4;
                      psVar30 = psVar30 + lVar33;
                      psVar12 = psVar12 + lVar33;
                      lVar32 = lVar32 + lVar33;
                      psVar6 = psVar6 + lVar33;
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  break;
                case 5:
                  if (iVar3 != 0) {
                    lVar32 = (long)psVar30 + lVar9;
                    iVar28 = iVar3;
                    do {
                      if (0 < (int)uVar26) {
                        uVar17 = 0;
                        do {
                          psVar30[uVar17] = (*(byte *)(lVar32 + uVar17) >> 1) + raw[uVar17];
                          uVar17 = uVar17 + 1;
                        } while (uVar26 != uVar17);
                      }
                      psVar30[(int)uVar4] = 0xff;
                      raw = raw + (int)uVar4;
                      psVar30 = psVar30 + lVar33;
                      lVar32 = lVar32 + lVar33;
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  break;
                case 6:
                  if (iVar3 != 0) {
                    lVar32 = (long)psVar30 + lVar9;
                    iVar28 = iVar3;
                    do {
                      if (0 < (int)uVar26) {
                        uVar17 = 0;
                        do {
                          psVar30[uVar17] = *(char *)(lVar32 + uVar17) + raw[uVar17];
                          uVar17 = uVar17 + 1;
                        } while (uVar26 != uVar17);
                      }
                      psVar30[(int)uVar4] = 0xff;
                      raw = raw + (int)uVar4;
                      psVar30 = psVar30 + lVar33;
                      lVar32 = lVar32 + lVar33;
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                }
                if (depth != 0x10) goto LAB_00326b0a;
                if (x != 0) {
                  psVar6 = a->out + (long)(int)uVar4 + uVar13 + 1;
                  sVar10 = x;
                  do {
                    *psVar6 = 0xff;
                    psVar6 = psVar6 + lVar33;
                    sVar10 = sVar10 - 1;
                  } while (sVar10 != 0);
                  goto LAB_00326b0a;
                }
                if (lVar23 + 1U == uVar8) goto LAB_00326b84;
              }
              lVar23 = lVar23 + 1;
              bVar21 = *raw;
              uVar13 = (ulong)(uVar19 * (int)lVar23);
              psVar6 = a->out + uVar13;
              uVar4 = uVar26;
            } while (bVar21 < 5);
          }
          stbi__g_failure_reason = "invalid filter";
        }
      }
    }
  }
  return local_dc;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }